

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall
choc::value::Type::ComplexArray::ComplexArray(ComplexArray *this,Allocator *a,ComplexArray *other)

{
  RepeatedGroup local_78;
  RepeatedGroup *local_50;
  RepeatedGroup *g;
  RepeatedGroup *__end2;
  RepeatedGroup *__begin2;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *__range2;
  RepeatedGroup *local_20;
  ComplexArray *other_local;
  Allocator *a_local;
  ComplexArray *this_local;
  
  local_20 = (RepeatedGroup *)other;
  other_local = (ComplexArray *)a;
  a_local = (Allocator *)this;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::AllocatedVector(&this->groups,a);
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
            (&this->groups,*(uint32_t *)&local_20->elementType);
  __begin2 = local_20;
  __end2 = AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::begin
                     ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)local_20);
  g = AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::end
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)__begin2);
  for (; __end2 != g; __end2 = __end2 + 1) {
    local_50 = __end2;
    RepeatedGroup::RepeatedGroup(&local_78,(Allocator *)other_local,__end2);
    AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::push_back
              (&this->groups,&local_78);
    RepeatedGroup::~RepeatedGroup(&local_78);
  }
  return;
}

Assistant:

ComplexArray (Allocator* a, const ComplexArray& other) : groups (a)
    {
        groups.reserve (other.groups.size);

        for (auto& g : other.groups)
            groups.push_back ({ a, g });
    }